

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void doWriteRead(pixels *p,string *filename,string *cppfilename,bool tiled,int xs,int ys,
                exr_compression_t comp,char *pattern)

{
  Channel *pCVar1;
  Slice *pSVar2;
  string *psVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  exr_compression_t *peVar12;
  undefined4 *puVar13;
  undefined7 in_register_00000009;
  int *piVar14;
  int32_t *func;
  pixels *ppVar15;
  exr_context_t p_Var16;
  char cVar17;
  ulong uVar18;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar19;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  ulong uVar20;
  string *filename_00;
  uint uVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  char *pcVar25;
  long lVar26;
  float fVar27;
  float fVar28;
  exr_context_t f;
  int partidx;
  undefined8 local_570;
  pixels *local_568;
  int32_t tilew;
  char *local_558;
  uint local_54c;
  exr_context_t local_548;
  ulong local_540;
  int local_538;
  int32_t tileh;
  int32_t tlevy;
  undefined4 local_52c;
  ulong local_528;
  char *local_520;
  ulong local_518;
  string *local_510;
  string *local_508;
  ulong local_500;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  int local_4e8;
  uint local_4e4;
  int local_4e0;
  int zlev;
  int32_t local_4d8;
  int32_t pixelstride;
  exr_attr_box2i_t dataW;
  pixels cpprestore;
  pixels cpploadc;
  pixels restore;
  pixels cpploadcpp;
  char local_98 [88];
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  pcVar10 = (char *)CONCAT44(in_register_0000008c,ys);
  local_570 = CONCAT44(in_register_00000084,xs);
  local_538 = (int)CONCAT71(in_register_00000009,tiled);
  uVar18 = (long)p->_w * (long)xs;
  local_540 = (ulong)ys;
  pcVar25 = (char *)((long)p->_h * local_540);
  uVar21 = xs * 0x11;
  uVar22 = ys * 0x1d;
  pcVar9 = local_98;
  uStack_38 = 0;
  local_98[0x48] = '\0';
  local_98[0x49] = '\0';
  local_98[0x4a] = '\0';
  local_98[0x4b] = '\0';
  local_98[0x4c] = '\0';
  local_98[0x4d] = '\0';
  local_98[0x4e] = '\0';
  local_98[0x4f] = '\0';
  local_98[0x50] = '\0';
  local_98[0x51] = '\0';
  local_98[0x52] = '\0';
  local_98[0x53] = '\0';
  local_98[0x54] = '\0';
  local_98[0x55] = '\0';
  local_98[0x56] = '\0';
  local_98[0x57] = '\0';
  local_98[0x38] = '\0';
  local_98[0x39] = '\0';
  local_98[0x3a] = '\0';
  local_98[0x3b] = '\0';
  local_98[0x3c] = '\0';
  local_98[0x3d] = '\0';
  local_98[0x3e] = '\0';
  local_98[0x3f] = '\0';
  local_98[0x40] = '\0';
  local_98[0x41] = '\0';
  local_98[0x42] = '\0';
  local_98[0x43] = '\0';
  local_98[0x44] = '\0';
  local_98[0x45] = '\0';
  local_98[0x46] = '\0';
  local_98[0x47] = '\0';
  local_98[0x28] = '\0';
  local_98[0x29] = '\0';
  local_98[0x2a] = '\0';
  local_98[0x2b] = '\0';
  local_98[0x2c] = '\0';
  local_98[0x2d] = '\0';
  local_98[0x2e] = '\0';
  local_98[0x2f] = '\0';
  local_98[0x30] = '\0';
  local_98[0x31] = '\0';
  local_98[0x32] = '\0';
  local_98[0x33] = '\0';
  local_98[0x34] = '\0';
  local_98[0x35] = '\0';
  local_98[0x36] = '\0';
  local_98[0x37] = '\0';
  local_98[0x18] = '\0';
  local_98[0x19] = '\0';
  local_98[0x1a] = '\0';
  local_98[0x1b] = '\0';
  local_98[0x1c] = '\0';
  local_98[0x1d] = '\0';
  local_98[0x1e] = '\0';
  local_98[0x1f] = '\0';
  local_98[0x20] = '\0';
  local_98[0x21] = '\0';
  local_98[0x22] = '\0';
  local_98[0x23] = '\0';
  local_98[0x24] = '\0';
  local_98[0x25] = '\0';
  local_98[0x26] = '\0';
  local_98[0x27] = '\0';
  local_98[8] = '\0';
  local_98[9] = '\0';
  local_98[10] = '\0';
  local_98[0xb] = '\0';
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98[0xe] = '\0';
  local_98[0xf] = '\0';
  local_98[0x10] = '\0';
  local_98[0x11] = '\0';
  local_98[0x12] = '\0';
  local_98[0x13] = '\0';
  local_98[0x14] = '\0';
  local_98[0x15] = '\0';
  local_98[0x16] = '\0';
  local_98[0x17] = '\0';
  local_98[0] = 'h';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  local_40 = 0;
  uStack_3c = 0xbf800000;
  local_568 = p;
  local_510 = cppfilename;
  local_508 = filename;
  exr_set_default_zip_compression_level(0xffffffffffffffff);
  psVar3 = local_508;
  iVar6 = local_538;
  _local_40 = CONCAT44(uStack_3c,3);
  uStack_38 = CONCAT44(uStack_38._4_4_,8);
  local_4e8 = (int)uVar18 + -1 + uVar21;
  iVar23 = (int)pcVar25 + -1 + uVar22;
  local_558 = pcVar25;
  local_528 = uVar18;
  local_500 = (ulong)uVar21;
  dataW.min.field_0.field_0.x = uVar21;
  dataW.min.field_0.field_0.y = uVar22;
  dataW.max.field_0.field_0.x = local_4e8;
  dataW.max.field_0.field_0.y = iVar23;
  poVar8 = std::operator<<((ostream *)&std::cout,"  ");
  poVar8 = std::operator<<(poVar8,pattern);
  poVar8 = std::operator<<(poVar8," tiled: ");
  pcVar25 = "no";
  if (iVar6 != 0) {
    pcVar25 = "yes";
  }
  poVar8 = std::operator<<(poVar8,pcVar25);
  poVar8 = std::operator<<(poVar8," sampling ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,xs);
  poVar8 = std::operator<<(poVar8,", ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)local_540);
  poVar8 = std::operator<<(poVar8," comp ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,comp);
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar5 = exr_start_write(&f,(psVar3->_M_dataplus)._M_p,0);
  if (iVar5 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar10 = (char *)exr_get_default_error_message(iVar5);
    poVar8 = std::operator<<(poVar8,pcVar10);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_start_write ( &f, filename.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit)",
                   (char *)0x505,0x14eac5,pcVar9);
  }
  cVar17 = (char)iVar6;
  local_518 = (ulong)uVar22;
  if (cVar17 == '\0') {
    piVar14 = &partidx;
    iVar6 = exr_add_part(f,"scan",0);
    if (iVar6 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
      poVar8 = std::operator<<(poVar8,") ");
      pcVar9 = (char *)exr_get_default_error_message(iVar6);
      poVar8 = std::operator<<(poVar8,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar8);
      core_test_fail("exr_add_part (f, \"scan\", EXR_STORAGE_SCANLINE, &partidx)",(char *)0x50e,
                     0x14eac5,(char *)piVar14);
    }
  }
  else {
    piVar14 = &partidx;
    iVar6 = exr_add_part(f,"tiled",1);
    if (iVar6 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
      poVar8 = std::operator<<(poVar8,") ");
      pcVar9 = (char *)exr_get_default_error_message(iVar6);
      poVar8 = std::operator<<(poVar8,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar8);
      core_test_fail("exr_add_part (f, \"tiled\", EXR_STORAGE_TILED, &partidx)",(char *)0x509,
                     0x14eac5,(char *)piVar14);
    }
  }
  uVar18 = local_528;
  pcVar9 = local_558;
  iVar6 = exr_initialize_required_attr_simple(f,partidx,local_528 & 0xffffffff);
  if (iVar6 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar10 = (char *)exr_get_default_error_message(iVar6);
    poVar8 = std::operator<<(poVar8,pcVar10);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_initialize_required_attr_simple (f, partidx, fw, fh, comp)",(char *)0x512,
                   0x14eac5,pcVar9);
  }
  iVar6 = exr_set_data_window(f,partidx,&dataW);
  if (iVar6 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar10 = (char *)exr_get_default_error_message(iVar6);
    poVar8 = std::operator<<(poVar8,pcVar10);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_set_data_window (f, partidx, &dataW)",(char *)0x513,0x14eac5,pcVar9);
  }
  iVar6 = exr_get_zip_compression_level(f,partidx,&zlev);
  if (iVar6 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar10 = (char *)exr_get_default_error_message(iVar6);
    poVar8 = std::operator<<(poVar8,pcVar10);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_get_zip_compression_level (f, partidx, &zlev)",(char *)0x516,0x14eac5,pcVar9
                  );
  }
  if (zlev != 3) {
    core_test_fail("zlev == 3",(char *)0x517,0x14eac5,pcVar9);
  }
  iVar6 = exr_set_zip_compression_level(f,partidx,4);
  if (iVar6 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar10 = (char *)exr_get_default_error_message(iVar6);
    poVar8 = std::operator<<(poVar8,pcVar10);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_set_zip_compression_level (f, partidx, 4)",(char *)0x518,0x14eac5,pcVar9);
  }
  if (cVar17 != '\0') {
    pcVar9 = (char *)0x20;
    iVar6 = exr_set_tile_descriptor(f,partidx,0x20,0x20,0,1);
    if (iVar6 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
      poVar8 = std::operator<<(poVar8,") ");
      pcVar10 = (char *)exr_get_default_error_message(iVar6);
      poVar8 = std::operator<<(poVar8,pcVar10);
      std::endl<char,std::char_traits<char>>(poVar8);
      core_test_fail("exr_set_tile_descriptor ( f, partidx, 32, 32, EXR_TILE_ONE_LEVEL, EXR_TILE_ROUND_UP)"
                     ,(char *)0x51c,0x14eac5,pcVar9);
    }
  }
  pcVar9 = (char *)0x0;
  local_4ec = iVar23;
  iVar6 = exr_add_channel(f,partidx,"I",0,0,local_570,pcVar10);
  if (iVar6 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar10 = (char *)exr_get_default_error_message(iVar6);
    poVar8 = std::operator<<(poVar8,pcVar10);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_add_channel ( f, partidx, \"I\", EXR_PIXEL_UINT, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys)"
                   ,(char *)0x520,0x14eac5,pcVar9);
  }
  local_4f0 = (int)uVar18 + -1;
  local_4f4 = (int)local_558 + -1;
  lVar24 = 0;
  while( true ) {
    if (lVar24 == 0x28) break;
    pcVar9 = (char *)0x1;
    iVar6 = exr_add_channel(f,partidx,*(undefined8 *)((long)channels + lVar24),1,0,local_570,pcVar10
                           );
    lVar24 = lVar24 + 8;
    if (iVar6 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
      poVar8 = std::operator<<(poVar8,") ");
      pcVar10 = (char *)exr_get_default_error_message(iVar6);
      poVar8 = std::operator<<(poVar8,pcVar10);
      std::endl<char,std::char_traits<char>>(poVar8);
      core_test_fail("exr_add_channel ( f, partidx, channels[c], EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys)"
                     ,(char *)0x52b,0x14eac5,pcVar9);
    }
  }
  ppVar15 = (pixels *)0x2;
  iVar6 = exr_add_channel(f,partidx,"F",2,0,local_570,pcVar10);
  if (iVar6 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar6);
    poVar8 = std::operator<<(poVar8,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_add_channel ( f, partidx, \"F\", EXR_PIXEL_FLOAT, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys)"
                   ,(char *)0x534,0x14eac5,(char *)ppVar15);
  }
  iVar6 = exr_write_header(f);
  if (iVar6 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar6);
    poVar8 = std::operator<<(poVar8,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_write_header (f)",(char *)0x536,0x14eac5,(char *)ppVar15);
  }
  local_548 = f;
  if ((char)local_538 == '\0') {
    cpploadcpp._0_8_ = cpploadcpp._0_8_ & 0xffffffff00000000;
    iVar6 = exr_get_scanlines_per_chunk(f,0);
    if (iVar6 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
      poVar8 = std::operator<<(poVar8,") ");
      pcVar9 = (char *)exr_get_default_error_message(iVar6);
      poVar8 = std::operator<<(poVar8,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar8);
      core_test_fail("exr_get_scanlines_per_chunk (f, 0, &scansperchunk)",(char *)0x2ef,0x14f1ce,
                     (char *)ppVar15);
    }
    local_520 = (char *)CONCAT44(local_520._4_4_,(int)pcVar10 * 0xbc);
    uVar20 = CONCAT71((int7)(int3)((uint)xs >> 8),1);
    uVar11 = local_518 & 0xffffffff;
    while( true ) {
      if ((int)local_520 <= (int)uVar11) break;
      local_540 = CONCAT44(local_540._4_4_,(int)uVar11);
      ppVar15 = &cpprestore;
      iVar6 = exr_write_scanline_chunk_info(local_548,0);
      uVar18 = local_518;
      if (iVar6 != 0) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
        poVar8 = std::operator<<(poVar8,") ");
        pcVar9 = (char *)exr_get_default_error_message(iVar6);
        poVar8 = std::operator<<(poVar8,pcVar9);
        std::endl<char,std::char_traits<char>>(poVar8);
        core_test_fail("exr_write_scanline_chunk_info (f, 0, y, &cinfo)",(char *)0x2f4,0x14f1ce,
                       (char *)ppVar15);
      }
      local_54c = (uint)uVar20;
      if ((uVar20 & 1) == 0) {
        ppVar15 = &restore;
        iVar6 = exr_encoding_update(local_548,0,&cpprestore);
        if (iVar6 != 0) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
          poVar8 = std::operator<<(poVar8,") ");
          pcVar9 = (char *)exr_get_default_error_message(iVar6);
          poVar8 = std::operator<<(poVar8,pcVar9);
          std::endl<char,std::char_traits<char>>(poVar8);
          core_test_fail("exr_encoding_update (f, 0, &cinfo, &encoder)",(char *)0x2fc,0x14f1ce,
                         (char *)ppVar15);
        }
      }
      else {
        ppVar15 = &restore;
        iVar6 = exr_encoding_initialize(local_548,0,&cpprestore);
        if (iVar6 != 0) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
          poVar8 = std::operator<<(poVar8,") ");
          pcVar9 = (char *)exr_get_default_error_message(iVar6);
          poVar8 = std::operator<<(poVar8,pcVar9);
          std::endl<char,std::char_traits<char>>(poVar8);
          core_test_fail("exr_encoding_initialize (f, 0, &cinfo, &encoder)",(char *)0x2f8,0x14f1ce,
                         (char *)ppVar15);
        }
      }
      iVar23 = (int)local_540 - (int)uVar18;
      iVar5 = (int)pcVar10;
      iVar6 = local_568->_stride_x;
      lVar24 = 0;
      for (lVar26 = 0; uVar4 = restore._0_8_, lVar26 < (short)restore._stride_x; lVar26 = lVar26 + 1
          ) {
        if (*(int *)(restore._0_8_ + 8 + lVar24) == 0) {
          *(undefined8 *)(restore._0_8_ + 0x28 + lVar24) = 0;
          *(undefined4 *)(restore._0_8_ + 0x20 + lVar24) = 0;
          ppVar15 = (pixels *)0x0;
        }
        else {
          fill_pointers(local_568,(exr_coding_channel_info_t *)(restore._0_8_ + lVar24),
                        (iVar23 / iVar5) * iVar6,(void **)&cpploadc,&tlevy,&tilew);
          uVar21 = (uint)*(short *)(uVar4 + 0x1c + lVar24);
          if (tlevy != uVar21) {
            core_test_fail("curchan.user_bytes_per_element == pixelstride",(char *)0x314,0x14f1ce,
                           (char *)(ulong)uVar21);
          }
          *(ulong *)(restore._0_8_ + 0x28 + lVar24) = CONCAT44(cpploadc._h,cpploadc._w);
          *(uint *)(restore._0_8_ + 0x20 + lVar24) = uVar21;
          ppVar15 = (pixels *)(ulong)(uint)tilew;
        }
        *(int *)(restore._0_8_ + 0x24 + lVar24) = (int)ppVar15;
        lVar24 = lVar24 + 0x30;
      }
      if ((local_54c & 1) != 0) {
        iVar6 = exr_encoding_choose_default_routines(local_548,0,&restore);
        if (iVar6 != 0) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
          poVar8 = std::operator<<(poVar8,") ");
          pcVar9 = (char *)exr_get_default_error_message(iVar6);
          poVar8 = std::operator<<(poVar8,pcVar9);
          std::endl<char,std::char_traits<char>>(poVar8);
          core_test_fail("exr_encoding_choose_default_routines (f, 0, &encoder)",(char *)0x31e,
                         0x14f1ce,(char *)ppVar15);
        }
      }
      iVar6 = exr_encoding_run(local_548,0,&restore);
      if (iVar6 != 0) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
        poVar8 = std::operator<<(poVar8,") ");
        pcVar9 = (char *)exr_get_default_error_message(iVar6);
        poVar8 = std::operator<<(poVar8,pcVar9);
        std::endl<char,std::char_traits<char>>(poVar8);
        core_test_fail("exr_encoding_run (f, 0, &encoder)",(char *)0x320,0x14f1ce,(char *)ppVar15);
      }
      uVar11 = (ulong)(uint)((int)local_540 + cpploadcpp._w);
      uVar20 = 0;
      uVar18 = local_528;
    }
    iVar6 = exr_encoding_destroy(local_548,&restore);
    if (iVar6 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
      poVar8 = std::operator<<(poVar8,") ");
      pcVar9 = (char *)exr_get_default_error_message(iVar6);
      poVar8 = std::operator<<(poVar8,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar8);
      core_test_fail("exr_encoding_destroy (f, &encoder)",(char *)0x324,0x14f1ce,(char *)ppVar15);
    }
  }
  else {
    if (((int)local_570 != 1) || ((int)pcVar10 != 1)) {
      core_test_fail("xs == 1 && ys == 1",(char *)0x335,0x14ef14,(char *)ppVar15);
    }
    func = &tlevy;
    iVar6 = exr_get_tile_levels(f,0,&cpploadcpp);
    if (iVar6 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
      poVar8 = std::operator<<(poVar8,") ");
      pcVar9 = (char *)exr_get_default_error_message(iVar6);
      poVar8 = std::operator<<(poVar8,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar8);
      core_test_fail("exr_get_tile_levels (f, 0, &tlevx, &tlevy)",(char *)0x336,0x14ef14,
                     (char *)func);
    }
    if ((cpploadcpp._w != 1) || (tlevy != 1)) {
      core_test_fail("tlevx == 1 && tlevy == 1",(char *)0x337,0x14ef14,(char *)func);
    }
    pcVar9 = (char *)0x0;
    uVar11 = exr_get_tile_sizes(local_548,0,0,0,&tilew,&tileh);
    if ((int)uVar11 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)uVar11);
      poVar8 = std::operator<<(poVar8,") ");
      pcVar10 = (char *)exr_get_default_error_message(uVar11 & 0xffffffff);
      poVar8 = std::operator<<(poVar8,pcVar10);
      std::endl<char,std::char_traits<char>>(poVar8);
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &tilew, &tileh)",(char *)0x339,0x14ef14,pcVar9
                    );
    }
    if ((tilew != 0x20) || (tileh != 0x20)) {
      core_test_fail("tilew == 32 && tileh == 32",(char *)0x33a,0x14ef14,pcVar9);
    }
    local_520 = (char *)0x0;
    local_540 = CONCAT44(local_540._4_4_,(int)CONCAT71((int7)(uVar11 >> 8),1));
    p_Var16 = local_548;
    for (ppVar15 = (pixels *)0x1d; (int)(uint)ppVar15 < 0xbc;
        ppVar15 = (pixels *)(ulong)(uint)((int)ppVar15 + tileh)) {
      uVar21 = 0;
      iVar6 = 0x11;
      local_4e4 = (uint)ppVar15;
      while (iVar6 < 0x56c) {
        pcVar9 = local_520;
        local_54c = uVar21;
        local_4e0 = iVar6;
        iVar6 = exr_write_tile_chunk_info(p_Var16,0);
        if (iVar6 != 0) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
          poVar8 = std::operator<<(poVar8,") ");
          pcVar10 = (char *)exr_get_default_error_message(iVar6);
          poVar8 = std::operator<<(poVar8,pcVar10);
          std::endl<char,std::char_traits<char>>(poVar8);
          core_test_fail("exr_write_tile_chunk_info (f, 0, tilex, tiley, 0, 0, &cinfo)",
                         (char *)0x348,0x14ef14,pcVar9);
        }
        if ((local_540 & 1) == 0) {
          ppVar15 = &restore;
          iVar6 = exr_encoding_update(p_Var16,0,&cpprestore);
          if (iVar6 != 0) {
            poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
            poVar8 = std::operator<<(poVar8,") ");
            pcVar9 = (char *)exr_get_default_error_message(iVar6);
            poVar8 = std::operator<<(poVar8,pcVar9);
            std::endl<char,std::char_traits<char>>(poVar8);
            core_test_fail("exr_encoding_update (f, 0, &cinfo, &encoder)",(char *)0x351,0x14ef14,
                           (char *)ppVar15);
          }
        }
        else {
          ppVar15 = &restore;
          iVar6 = exr_encoding_initialize(p_Var16,0,&cpprestore);
          if (iVar6 != 0) {
            poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
            poVar8 = std::operator<<(poVar8,") ");
            pcVar9 = (char *)exr_get_default_error_message(iVar6);
            poVar8 = std::operator<<(poVar8,pcVar9);
            std::endl<char,std::char_traits<char>>(poVar8);
            core_test_fail("exr_encoding_initialize (f, 0, &cinfo, &encoder)",(char *)0x34c,0x14ef14
                           ,(char *)ppVar15);
          }
        }
        iVar23 = tileh * (int)local_520;
        iVar6 = local_568->_stride_x;
        iVar5 = tilew * local_54c;
        lVar26 = 0;
        for (lVar24 = 0; uVar4 = restore._0_8_, p_Var16 = local_548,
            lVar24 < (short)restore._stride_x; lVar24 = lVar24 + 1) {
          ppVar15 = &cpploadc;
          fill_pointers(local_568,(exr_coding_channel_info_t *)(restore._0_8_ + lVar26),
                        iVar5 + iVar23 * iVar6,(void **)ppVar15,&pixelstride,&local_4d8);
          iVar7 = (int)*(short *)(uVar4 + 0x1c + lVar26);
          if (pixelstride != iVar7) {
            core_test_fail("curchan.user_bytes_per_element == pixelstride",(char *)0x361,0x14ef14,
                           (char *)ppVar15);
          }
          *(ulong *)(restore._0_8_ + 0x28 + lVar26) = CONCAT44(cpploadc._h,cpploadc._w);
          *(int *)(restore._0_8_ + 0x20 + lVar26) = iVar7;
          *(int32_t *)(restore._0_8_ + 0x24 + lVar26) = local_4d8;
          lVar26 = lVar26 + 0x30;
          ppVar15 = (pixels *)restore._0_8_;
        }
        if ((local_540 & 1) != 0) {
          iVar6 = exr_encoding_choose_default_routines(local_548,0,&restore);
          if (iVar6 != 0) {
            poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
            poVar8 = std::operator<<(poVar8,") ");
            pcVar9 = (char *)exr_get_default_error_message(iVar6);
            poVar8 = std::operator<<(poVar8,pcVar9);
            std::endl<char,std::char_traits<char>>(poVar8);
            core_test_fail("exr_encoding_choose_default_routines (f, 0, &encoder)",(char *)0x36b,
                           0x14ef14,(char *)ppVar15);
          }
        }
        iVar6 = exr_encoding_run(p_Var16,0,&restore);
        if (iVar6 != 0) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
          poVar8 = std::operator<<(poVar8,") ");
          pcVar9 = (char *)exr_get_default_error_message(iVar6);
          poVar8 = std::operator<<(poVar8,pcVar9);
          std::endl<char,std::char_traits<char>>(poVar8);
          core_test_fail("exr_encoding_run (f, 0, &encoder)",(char *)0x36d,0x14ef14,(char *)ppVar15)
          ;
        }
        uVar21 = local_54c + 1;
        local_540 = local_540 & 0xffffffff00000000;
        ppVar15 = (pixels *)(ulong)local_4e4;
        uVar18 = local_528;
        iVar6 = local_4e0 + tilew;
      }
      local_520 = (char *)(ulong)((int)local_520 + 1);
    }
    iVar6 = exr_encoding_destroy(p_Var16,&restore);
    if (iVar6 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
      poVar8 = std::operator<<(poVar8,") ");
      pcVar9 = (char *)exr_get_default_error_message(iVar6);
      poVar8 = std::operator<<(poVar8,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar8);
      core_test_fail("exr_encoding_destroy (f, &encoder)",(char *)0x371,0x14ef14,(char *)ppVar15);
    }
  }
  iVar6 = exr_finish(&f);
  if (iVar6 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar6);
    poVar8 = std::operator<<(poVar8,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_finish (&f)",(char *)0x53b,0x14eac5,(char *)ppVar15);
  }
  cpprestore._w = 0;
  cpprestore._h = 0;
  cpprestore._stride_x = local_4f0;
  cpprestore._12_4_ = local_4f4;
  cpploadc._w = (int)local_500;
  cpploadc._h = (int)local_518;
  cpploadc._stride_x = local_4e8;
  cpploadc._12_4_ = local_4ec;
  ppVar15 = &cpploadcpp;
  cpploadcpp._w = 0;
  cpploadcpp._h = 0;
  Imf_3_2::Header::Header
            ((Header *)&restore,(Box *)&cpprestore,(Box *)&cpploadc,1.0,(Vec2 *)ppVar15,1.0,
             INCREASING_Y,ZIP_COMPRESSION);
  peVar12 = (exr_compression_t *)Imf_3_2::Header::compression();
  *peVar12 = comp;
  puVar13 = (undefined4 *)Imf_3_2::Header::zipCompressionLevel();
  *puVar13 = 3;
  iVar6 = Imf_3_2::Header::zipCompressionLevel();
  if (iVar6 != 3) {
    core_test_fail("((const Header&) hdr).zipCompressionLevel () == 3",(char *)0x424,0x14f265,
                   (char *)ppVar15);
  }
  pcVar9 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&cpprestore,UINT,(int)local_570,(int)pcVar10,false);
  Imf_3_2::ChannelList::insert(pcVar9,(Channel *)0x1552aa);
  for (lVar24 = 0; lVar24 != 0x28; lVar24 = lVar24 + 8) {
    pcVar9 = (char *)Imf_3_2::Header::channels();
    pCVar1 = *(Channel **)((long)channels + lVar24);
    Imf_3_2::Channel::Channel((Channel *)&cpprestore,HALF,(int)local_570,(int)pcVar10,false);
    Imf_3_2::ChannelList::insert(pcVar9,pCVar1);
    uVar18 = local_528;
  }
  pcVar9 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&cpprestore,FLOAT,(int)local_570,(int)pcVar10,false);
  Imf_3_2::ChannelList::insert(pcVar9,(Channel *)0x155304);
  cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&cpploadc._stride_x;
  cpploadc._stride_x = 0;
  cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cpploadc.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tlevy = (int32_t)local_500;
  local_52c = (undefined4)local_518;
  cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  Imf_3_2::Slice::Make
            ((PixelType)&cpprestore,(void *)0x0,
             (Vec2 *)(local_568->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,(long)&tlevy,uVar18,(ulong)local_558,0
             ,local_568->_stride_x << 2,(int)local_570,0.0,SUB81(pcVar10,0),false);
  Imf_3_2::FrameBuffer::insert((char *)&cpploadc,(Slice *)0x1552aa);
  Imf_3_2::Slice::Make
            ((PixelType)&cpprestore,(void *)0x1,
             (Vec2 *)(local_568->h).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start,(long)&tlevy,uVar18,(ulong)local_558,0,
             local_568->_stride_x * 2,(int)local_570,0.0,SUB81(pcVar10,0),false);
  Imf_3_2::FrameBuffer::insert((char *)&cpploadc,(Slice *)0x14dbbd);
  Imf_3_2::Slice::Make
            ((PixelType)&cpprestore,(void *)0x2,
             (Vec2 *)(local_568->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,(long)&tlevy,uVar18,(ulong)local_558,0,
             local_568->_stride_x << 2,(int)local_570,0.0,SUB81(pcVar10,0),false);
  Imf_3_2::FrameBuffer::insert((char *)&cpploadc,(Slice *)0x155304);
  pvVar19 = local_568->rgba;
  for (lVar24 = 0; psVar3 = local_510, lVar24 != 0x20; lVar24 = lVar24 + 8) {
    pSVar2 = *(Slice **)((long)channels + lVar24);
    Imf_3_2::Slice::Make
              ((PixelType)&cpprestore,(void *)0x1,
               (Vec2 *)(pvVar19->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       )._M_impl.super__Vector_impl_data._M_start,(long)&tlevy,uVar18,
               (ulong)local_558,0,local_568->_stride_x * 2,(int)local_570,0.0,SUB81(pcVar10,0),false
              );
    Imf_3_2::FrameBuffer::insert((char *)&cpploadc,pSVar2);
    pvVar19 = pvVar19 + 1;
    uVar18 = local_528;
  }
  cVar17 = (char)local_538;
  if (cVar17 == '\0') {
    pcVar9 = (local_510->_M_dataplus)._M_p;
    uVar21 = Imf_3_2::globalThreadCount();
    filename_00 = local_508;
    pcVar25 = (char *)(ulong)uVar21;
    Imf_3_2::OutputFile::OutputFile((OutputFile *)&cpprestore,pcVar9,(Header *)&restore,uVar21);
    Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&cpprestore);
    Imf_3_2::OutputFile::writePixels((int)&cpprestore);
    Imf_3_2::OutputFile::~OutputFile((OutputFile *)&cpprestore);
  }
  else {
    cpploadcpp._w = 0x20;
    cpploadcpp._h = 0x20;
    cpploadcpp._stride_x = 0;
    cpploadcpp._12_4_ = 0;
    Imf_3_2::Header::setTileDescription((TileDescription *)&restore);
    filename_00 = local_508;
    pcVar9 = (psVar3->_M_dataplus)._M_p;
    iVar6 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledOutputFile::TiledOutputFile
              ((TiledOutputFile *)&cpprestore,pcVar9,(Header *)&restore,iVar6);
    Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&cpprestore);
    uVar11 = (ulong)cpploadcpp._0_8_ >> 0x20;
    fVar27 = ceilf((float)(int)uVar18 / (float)(cpploadcpp._0_8_ & 0xffffffff));
    fVar28 = ceilf((float)(int)local_558 / (float)uVar11);
    pcVar25 = (char *)0x0;
    Imf_3_2::TiledOutputFile::writeTiles
              ((int)&cpprestore,0,(int)(fVar27 + -1.0),0,(int)(fVar28 + -1.0));
    Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&cpprestore);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&cpploadc);
  Imf_3_2::Header::~Header((Header *)&restore);
  pcVar9 = getenv("ENABLE_EXACT_FILE_COMPARE");
  if (pcVar9 != (char *)0x0) {
    iVar6 = compare_files((filename_00->_M_dataplus)._M_p,(psVar3->_M_dataplus)._M_p);
    if (iVar6 != 0) {
      core_test_fail("compare_files",(char *)0x54c,0x14eac5,pcVar25);
    }
  }
  compare_files((filename_00->_M_dataplus)._M_p,(psVar3->_M_dataplus)._M_p);
  ppVar15 = local_568;
  pixels::pixels(&restore,local_568);
  pixels::pixels(&cpprestore,ppVar15);
  pixels::pixels(&cpploadc,ppVar15);
  pixels::pixels(&cpploadcpp,ppVar15);
  pixels::fillDead(&restore);
  pixels::fillDead(&cpprestore);
  pixels::fillDead(&cpploadc);
  pixels::fillDead(&cpploadcpp);
  iVar6 = exr_start_read(&f,(filename_00->_M_dataplus)._M_p,local_98);
  if (iVar6 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar6);
    poVar8 = std::operator<<(poVar8,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_start_read (&f, filename.c_str (), &cinit)",(char *)0x55d,0x14eac5,pcVar25);
  }
  pcVar9 = pcVar10;
  if (cVar17 == '\0') {
    doDecodeScan(f,&restore,(int)local_570,(int)pcVar10);
  }
  else {
    doDecodeTile(f,&restore,(int)local_570,(int)pcVar10);
  }
  iVar6 = exr_finish(&f);
  if (iVar6 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar6);
    poVar8 = std::operator<<(poVar8,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_finish (&f)",(char *)0x562,0x14eac5,pcVar10);
  }
  iVar6 = exr_start_read(&f,(psVar3->_M_dataplus)._M_p,local_98);
  if (iVar6 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar6);
    poVar8 = std::operator<<(poVar8,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_start_read (&f, cppfilename.c_str (), &cinit)",(char *)0x564,0x14eac5,
                   pcVar10);
  }
  if (cVar17 == '\0') {
    pcVar10 = pcVar9;
    doDecodeScan(f,&cpprestore,(int)local_570,(int)pcVar9);
    iVar6 = (int)pcVar10;
  }
  else {
    pcVar10 = pcVar9;
    doDecodeTile(f,&cpprestore,(int)local_570,(int)pcVar9);
    iVar6 = (int)pcVar10;
  }
  iVar23 = exr_finish(&f);
  if (iVar23 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar23);
    poVar8 = std::operator<<(poVar8,") ");
    pcVar10 = (char *)exr_get_default_error_message(iVar23);
    poVar8 = std::operator<<(poVar8,pcVar10);
    std::endl<char,std::char_traits<char>>(poVar8);
    core_test_fail("exr_finish (&f)",(char *)0x569,0x14eac5,pcVar9);
  }
  iVar23 = (int)local_558;
  iVar7 = (int)local_500;
  iVar5 = (int)local_518;
  loadCPP(&cpploadcpp,psVar3,SUB81(uVar18,0),iVar23,iVar7,iVar5,iVar6);
  loadCPP(&cpploadc,filename_00,SUB81(uVar18,0),iVar23,iVar7,iVar5,iVar6);
  if (comp - EXR_COMPRESSION_LAST_TYPE < 0xfffffffe) {
    pixels::compareExact(&cpploadcpp,&cpploadc,"C++ loaded C","C++ loaded C++");
    pixels::compareExact(&restore,&cpprestore,"C loaded C++","C loaded C");
    pixels::compareExact(&restore,&cpploadc,"C++ loaded C","C loaded C");
    pixels::compareExact(&restore,&cpploadcpp,"C++ loaded C++","C loaded C");
    if (comp < EXR_COMPRESSION_PIZ) {
      pixels::compareExact(&restore,local_568,"orig","C loaded C");
      goto LAB_0010cff9;
    }
  }
  pixels::compareClose(&restore,local_568,comp,"orig","C loaded C");
LAB_0010cff9:
  remove((filename_00->_M_dataplus)._M_p);
  remove((psVar3->_M_dataplus)._M_p);
  pixels::~pixels(&cpploadcpp);
  pixels::~pixels(&cpploadc);
  pixels::~pixels(&cpprestore);
  pixels::~pixels(&restore);
  return;
}

Assistant:

static void
doWriteRead (
    pixels&            p,
    const std::string& filename,
    const std::string& cppfilename,
    bool               tiled,
    int                xs,
    int                ys,
    exr_compression_t  comp,
    const char*        pattern)
{
    exr_context_t             f;
    int                       partidx;
    int                       fw    = p._w * xs;
    int                       fh    = p._h * ys;
    int                       dwx   = IMG_DATA_X * xs;
    int                       dwy   = IMG_DATA_Y * ys;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    exr_attr_box2i_t          dataW;

    exr_set_default_zip_compression_level (-1);
    cinit.zip_level = 3;
    cinit.flags |= EXR_CONTEXT_FLAG_WRITE_LEGACY_HEADER;

    dataW.min.x = dwx;
    dataW.min.y = dwy;
    dataW.max.x = dwx + fw - 1;
    dataW.max.y = dwy + fh - 1;

    std::cout << "  " << pattern << " tiled: " << (tiled ? "yes" : "no")
              << " sampling " << xs << ", " << ys << " comp " << (int) comp
              << std::endl;

    EXRCORE_TEST_RVAL (exr_start_write (
        &f, filename.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    if (tiled)
    {
        EXRCORE_TEST_RVAL (
            exr_add_part (f, "tiled", EXR_STORAGE_TILED, &partidx));
    }
    else
    {
        EXRCORE_TEST_RVAL (
            exr_add_part (f, "scan", EXR_STORAGE_SCANLINE, &partidx));
    }

    EXRCORE_TEST_RVAL (
        exr_initialize_required_attr_simple (f, partidx, fw, fh, comp));
    EXRCORE_TEST_RVAL (exr_set_data_window (f, partidx, &dataW));

    int zlev;
    EXRCORE_TEST_RVAL (exr_get_zip_compression_level (f, partidx, &zlev));
    EXRCORE_TEST (zlev == 3);
    EXRCORE_TEST_RVAL (exr_set_zip_compression_level (f, partidx, 4));
    if (tiled)
    {
        EXRCORE_TEST_RVAL (exr_set_tile_descriptor (
            f, partidx, 32, 32, EXR_TILE_ONE_LEVEL, EXR_TILE_ROUND_UP));
    }

    EXRCORE_TEST_RVAL (exr_add_channel (
        f, partidx, "I", EXR_PIXEL_UINT, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys));

    for (int c = 0; c < 5; ++c)
    {
        EXRCORE_TEST_RVAL (exr_add_channel (
            f,
            partidx,
            channels[c],
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            xs,
            ys));
    }
    EXRCORE_TEST_RVAL (exr_add_channel (
        f,
        partidx,
        "F",
        EXR_PIXEL_FLOAT,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        xs,
        ys));

    EXRCORE_TEST_RVAL (exr_write_header (f));
    if (tiled)
        doEncodeTile (f, p, xs, ys);
    else
        doEncodeScan (f, p, xs, ys);
    EXRCORE_TEST_RVAL (exr_finish (&f));

    try
    {
        saveCPP (p, cppfilename, tiled, xs, ys, comp, fw, fh, dwx, dwy);
    }
    catch (std::exception& e)
    {
        std::cerr << "ERROR saving " << cppfilename << ": " << e.what ()
                  << std::endl;
        EXRCORE_TEST_FAIL (saveCPP);
    }

#ifdef __linux
    if (getenv ("ENABLE_EXACT_FILE_COMPARE") &&
        0 != compare_files (filename.c_str(), cppfilename.c_str()))
    {
        EXRCORE_TEST_FAIL (compare_files);
    }
    else
    {
        compare_files (filename.c_str(), cppfilename.c_str());
    }
#endif
    pixels restore    = p;
    pixels cpprestore = p;
    pixels cpploadc   = p;
    pixels cpploadcpp = p;

    restore.fillDead ();
    cpprestore.fillDead ();
    cpploadc.fillDead ();
    cpploadcpp.fillDead ();

    EXRCORE_TEST_RVAL (exr_start_read (&f, filename.c_str (), &cinit));
    if (tiled)
        doDecodeTile (f, restore, xs, ys);
    else
        doDecodeScan (f, restore, xs, ys);
    EXRCORE_TEST_RVAL (exr_finish (&f));

    EXRCORE_TEST_RVAL (exr_start_read (&f, cppfilename.c_str (), &cinit));
    if (tiled)
        doDecodeTile (f, cpprestore, xs, ys);
    else
        doDecodeScan (f, cpprestore, xs, ys);
    EXRCORE_TEST_RVAL (exr_finish (&f));

    try
    {
        loadCPP (cpploadcpp, cppfilename, tiled, fw, fh, dwx, dwy);
    }
    catch (std::exception& e)
    {
        std::cerr << "ERROR loading " << cppfilename << ": " << e.what ()
                  << std::endl;
        EXRCORE_TEST_FAIL (loadCPP);
    }

    try
    {
        loadCPP (cpploadc, filename, tiled, fw, fh, dwx, dwy);
    }
    catch (std::exception& e)
    {
        std::cerr << "ERROR loading " << filename << ": " << e.what ()
                  << std::endl;
        EXRCORE_TEST_FAIL (loadCPP);
    }

    /* DWAA / DWAB seems to have some small number of ULP differences between C & C++ */
    if (comp != EXR_COMPRESSION_DWAA && comp != EXR_COMPRESSION_DWAB)
    {
        cpploadcpp.compareExact (cpploadc, "C++ loaded C", "C++ loaded C++");
        restore.compareExact (cpprestore, "C loaded C++", "C loaded C");
        restore.compareExact (cpploadc, "C++ loaded C", "C loaded C");
        restore.compareExact (cpploadcpp, "C++ loaded C++", "C loaded C");
    }

    switch (comp)
    {
        case EXR_COMPRESSION_NONE:
        case EXR_COMPRESSION_RLE:
        case EXR_COMPRESSION_ZIP:
        case EXR_COMPRESSION_ZIPS:
            restore.compareExact (p, "orig", "C loaded C");
            break;
        case EXR_COMPRESSION_PIZ:
        case EXR_COMPRESSION_PXR24:
        case EXR_COMPRESSION_B44:
        case EXR_COMPRESSION_B44A:
        case EXR_COMPRESSION_DWAA:
        case EXR_COMPRESSION_DWAB:
            restore.compareClose (p, comp, "orig", "C loaded C");
            break;
        case EXR_COMPRESSION_LAST_TYPE:
        default:
            std::cerr << "Unknown compression type " << (int) (comp)
                      << std::endl;
            EXRCORE_TEST (false);
            break;
    }
    remove (filename.c_str ());
    remove (cppfilename.c_str ());
}